

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O0

void __thiscall amrex::TagBox::TagBox(TagBox *this,Box *bx,int n,Arena *ar)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  BaseFab<char> *in_RSI;
  Arena *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  BaseFab<char>::BaseFab
            (in_RSI,(Box *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(int)((ulong)in_RCX >> 0x20),
             in_RDI);
  in_RDI->_vptr_Arena = (_func_int **)&PTR__TagBox_018037c8;
  return;
}

Assistant:

TagBox::TagBox (const Box& bx, int n, Arena* ar)
    : BaseFab<TagBox::TagType>(bx,n,ar)
{}